

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

int __thiscall HighFreqSub::deregister(HighFreqSub *this)

{
  int iVar1;
  char *__s1;
  HighFreqDataType *in_RDI;
  char *recv;
  HighFreqDataType *this_00;
  HighFreqDataType *in_stack_ffffffffffffff70;
  int local_4;
  
  this_00 = (HighFreqDataType *)&stack0xffffffffffffff60;
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff70);
  HighFreqDataType::operator=(this_00,in_RDI);
  HighFreqDataType::~HighFreqDataType(this_00);
  zstr_send(*(void **)&in_RDI[1].name,"$DRG");
  __s1 = zstr_recv(*(void **)&in_RDI[1].name);
  iVar1 = strcmp(__s1,"$DRGD");
  if (iVar1 == 0) {
    free(__s1);
    local_4 = 0;
  }
  else {
    free(__s1);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int HighFreqSub::deregister(){
    dt = HighFreqDataType();
    zstr_send(actor, deregdt);
    char * recv = zstr_recv(actor);
    if(streq(recv, deregdone)){
        freen(recv);
        return 0;
    }else{
        freen(recv);
        return -1;
    }
}